

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O2

void __thiscall OpenMD::Mie::calcForce(Mie *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  pointer piVar3;
  long lVar4;
  long lVar5;
  Mie *this_00;
  RealType RVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int mAtt;
  int nRep;
  RealType myDeriv;
  RealType myPot;
  RealType rcos;
  RealType ros;
  uint local_98;
  int local_94;
  double local_90;
  RealType local_88;
  RealType local_80;
  double local_78;
  double local_70;
  RealType local_68;
  RealType local_60;
  double local_58;
  double local_50;
  Vector<double,_3U> local_48;
  Vector<double,_3U> local_30;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar3 = (this->MieTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar3[idat->atid1]].
                    super__Vector_base<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar5 = (long)piVar3[idat->atid2] * 0x28;
  local_70 = *(double *)(lVar4 + 8 + lVar5);
  local_90 = *(double *)(lVar4 + 0x10 + lVar5);
  local_94 = *(int *)(lVar4 + 0x18 + lVar5);
  local_98 = *(uint *)(lVar4 + 0x1c + lVar5);
  this_00 = (Mie *)(ulong)local_98;
  local_78 = *(double *)(lVar4 + 0x20 + lVar5);
  local_60 = 0.0;
  local_80 = 0.0;
  local_68 = 0.0;
  local_88 = 0.0;
  local_50 = idat->rij * local_90;
  getMieFunc(this_00,&local_50,&local_94,(int *)&local_98,&local_60,&local_68);
  if (idat->shiftedPot == true) {
    local_58 = idat->rcut * local_90;
    getMieFunc(this_00,&local_58,&local_94,(int *)&local_98,&local_80,&local_88);
    RVar6 = local_80;
    dVar9 = 0.0;
  }
  else {
    RVar6 = 0.0;
    dVar9 = 0.0;
    if (idat->shiftedForce == true) {
      local_58 = idat->rcut * local_90;
      getMieFunc(this_00,&local_58,&local_94,(int *)&local_98,&local_80,&local_88);
      RVar6 = (idat->rij - idat->rcut) * local_88 * local_90 + local_80;
      dVar9 = local_88;
    }
  }
  dVar1 = idat->sw;
  dVar2 = idat->vdwMult;
  dVar8 = (local_60 - RVar6) * local_78 * dVar2 * local_70;
  dVar7 = dVar1 * dVar8;
  idat->vpair = dVar8 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar7;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar7 + (idat->selePot).data_[1];
  }
  operator*(&local_48,&(idat->d).super_Vector<double,_3U>,
            local_90 * (local_68 - dVar9) * local_70 * local_78 * dVar2 * dVar1);
  operator/(&local_30,&local_48,idat->rij);
  Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,&local_30);
  return;
}

Assistant:

void Mie::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MieInteractionData& mixer =
        MixingMap[MieTids[idat.atid1]][MieTids[idat.atid2]];
    RealType sigmai  = mixer.sigmai;
    RealType epsilon = mixer.epsilon;
    int nRep         = mixer.nRep;
    int mAtt         = mixer.mAtt;
    RealType nmScale = mixer.nmScale;

    RealType ros;
    RealType rcos;
    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    ros = idat.rij * sigmai;

    getMieFunc(ros, nRep, mAtt, myPot, myDeriv);

    if (idat.shiftedPot) {
      rcos = idat.rcut * sigmai;
      getMieFunc(rcos, nRep, mAtt, myPotC, myDerivC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      rcos = idat.rcut * sigmai;
      getMieFunc(rcos, nRep, mAtt, myPotC, myDerivC);
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut) * sigmai;
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * nmScale * epsilon * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr = idat.sw * idat.vdwMult * nmScale * epsilon *
                    (myDeriv - myDerivC) * sigmai;

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }